

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O2

size_t duckdb_je_sz_psz_quantize_ceil(size_t size)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  
  sVar3 = duckdb_je_sz_psz_quantize_floor(size);
  if (sVar3 < size) {
    uVar6 = sVar3 - duckdb_je_sz_large_pad;
    if (uVar6 + 1 < 0x7000000000000001) {
      if (uVar6 == 0) {
        uVar5 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar5 = (uint)lVar1 ^ 0x3f;
      }
      iVar2 = 0x32 - uVar5;
      if (0x32 < uVar5) {
        iVar2 = 0;
      }
      bVar4 = 0xc;
      if (0x3fff < uVar6) {
        bVar4 = (char)iVar2 + 0xb;
      }
      uVar6 = (ulong)(((uint)(uVar6 >> (bVar4 & 0x3f)) & 3) + iVar2 * 4);
    }
    else {
      uVar6 = 199;
    }
    sVar3 = duckdb_je_sz_large_pad + duckdb_je_sz_pind2sz_tab[uVar6];
  }
  return sVar3;
}

Assistant:

size_t
sz_psz_quantize_ceil(size_t size) {
	size_t ret;

	assert(size > 0);
	assert(size - sz_large_pad <= SC_LARGE_MAXCLASS);
	assert((size & PAGE_MASK) == 0);

	ret = sz_psz_quantize_floor(size);
	if (ret < size) {
		/*
		 * Skip a quantization that may have an adequately large extent,
		 * because under-sized extents may be mixed in.  This only
		 * happens when an unusual size is requested, i.e. for aligned
		 * allocation, and is just one of several places where linear
		 * search would potentially find sufficiently aligned available
		 * memory somewhere lower.
		 */
		ret = sz_pind2sz(sz_psz2ind(ret - sz_large_pad + 1)) +
		    sz_large_pad;
	}
	return ret;
}